

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowViewportThumbnails(void)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *pIVar5;
  ImFont *font;
  char *text;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ImGuiContext *pIVar8;
  int iVar9;
  ImU32 IVar10;
  ImGuiViewportP **ppIVar11;
  ImGuiWindow **ppIVar12;
  char *text_end;
  int n;
  int iVar13;
  ulong uVar14;
  ImGuiWindow *this;
  int i;
  ImVector<ImGuiViewportP_*> *this_00;
  ImGuiViewportP *pIVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar21;
  undefined1 auVar20 [16];
  float fVar22;
  float fVar24;
  undefined1 auVar23 [16];
  ImRect IVar25;
  ImRect thumb_r_scaled;
  ImRect local_f8;
  ImRect local_e8;
  undefined1 local_d8 [16];
  ImVector<ImGuiViewportP_*> *local_c8;
  ImDrawList *local_c0;
  ulong local_b8;
  ImGuiViewportP *local_b0;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  
  pIVar3 = GImGui->CurrentWindow;
  this_00 = &GImGui->Viewports;
  _local_a8 = ZEXT816(0);
  for (iVar13 = 0; iVar9 = this_00->Size, iVar13 < iVar9; iVar13 = iVar13 + 1) {
    ppIVar11 = ImVector<ImGuiViewportP_*>::operator[](this_00,iVar13);
    IVar25 = ImGuiViewportP::GetMainRect(*ppIVar11);
    uVar18 = -(uint)(IVar25.Min.y < fStack_a0);
    uVar19 = -(uint)(IVar25.Min.x < fStack_9c);
    uVar16 = -(uint)((float)local_a8._0_4_ < IVar25.Max.y);
    uVar17 = -(uint)((float)local_a8._4_4_ < IVar25.Max.x);
    auVar20._0_4_ = ~uVar16 & local_a8._0_4_;
    auVar20._4_4_ = ~uVar17 & local_a8._4_4_;
    auVar20._8_4_ = ~uVar18 & (uint)fStack_a0;
    auVar20._12_4_ = ~uVar19 & (uint)fStack_9c;
    auVar7._4_4_ = (uint)IVar25.Max.x & uVar17;
    auVar7._0_4_ = (uint)IVar25.Max.y & uVar16;
    auVar7._8_4_ = (uint)IVar25.Min.y & uVar18;
    auVar7._12_4_ = (uint)IVar25.Min.x & uVar19;
    _local_a8 = auVar20 | auVar7;
  }
  IVar1 = (pIVar3->DC).CursorPos;
  fVar21 = local_a8._8_4_;
  fVar22 = local_a8._12_4_;
  local_98._8_4_ = fVar21;
  local_98._0_8_ = local_a8._8_8_;
  local_98._12_4_ = fVar22;
  local_88 = 0.125;
  fStack_84 = 0.125;
  uStack_80 = 0;
  uStack_7c = 0;
  local_78 = IVar1.x - fVar22 * 0.125;
  fStack_74 = IVar1.y - fVar21 * 0.125;
  fStack_70 = 0.0 - fVar21 * 0.0;
  fStack_6c = 0.0 - fVar22 * 0.0;
  uVar14 = 0;
  local_c8 = this_00;
  while ((int)uVar14 < iVar9) {
    local_b8 = uVar14;
    ppIVar11 = ImVector<ImGuiViewportP_*>::operator[](local_c8,(int)uVar14);
    pIVar8 = GImGui;
    pIVar15 = *ppIVar11;
    local_c0 = pIVar3->DrawList;
    pIVar4 = GImGui->CurrentWindow;
    IVar1 = (pIVar15->super_ImGuiViewport).Pos;
    IVar2 = (pIVar15->super_ImGuiViewport).Size;
    fVar21 = IVar1.x;
    fVar24 = IVar1.y;
    local_f8.Min.x = fVar21 * 0.125 + local_78;
    local_f8.Min.y = fVar24 * 0.125 + fStack_74;
    fVar22 = (fVar21 + IVar2.x) * 0.125 + local_78;
    fVar24 = (fVar24 + IVar2.y) * 0.125 + fStack_74;
    auVar23._0_4_ = fVar22 - local_f8.Min.x;
    auVar23._4_4_ = fVar24 - local_f8.Min.y;
    auVar23._8_4_ = (fStack_70 + 0.0) - (fStack_70 + 0.0);
    auVar23._12_4_ = (fStack_6c + 0.0) - (fStack_6c + 0.0);
    auVar6._8_8_ = 0;
    auVar6._0_4_ = IVar2.x;
    auVar6._4_4_ = IVar2.y;
    local_58 = divps(auVar23,auVar6);
    IVar1 = (pIVar15->super_ImGuiViewport).Pos;
    local_68 = local_f8.Min.x - IVar1.x * local_58._0_4_;
    fStack_64 = local_f8.Min.y - IVar1.y * local_58._4_4_;
    fStack_60 = (fStack_70 + 0.0) - local_58._8_4_ * 0.0;
    fStack_5c = (fStack_6c + 0.0) - local_58._12_4_ * 0.0;
    fVar21 = *(float *)(&DAT_0018f434 + (ulong)(-1 < (char)(pIVar15->super_ImGuiViewport).Flags) * 4
                       );
    pIVar5 = pIVar4->DrawList;
    local_f8.Max.x = fVar22;
    local_f8.Max.y = fVar24;
    IVar10 = GetColorU32(5,fVar21 * 0.4);
    ImDrawList::AddRectFilled(pIVar5,&local_f8.Min,&local_f8.Max,IVar10,0.0,0xf);
    local_b0 = pIVar15;
    for (iVar13 = 0; iVar13 != (pIVar8->Windows).Size; iVar13 = iVar13 + 1) {
      ppIVar12 = ImVector<ImGuiWindow_*>::operator[](&pIVar8->Windows,iVar13);
      this = *ppIVar12;
      if (((this->WasActive == true) && ((this->Flags & 0x1000000) == 0)) &&
         (this->Viewport == pIVar15)) {
        IVar25 = ImGuiWindow::Rect(this);
        local_48._8_4_ = extraout_XMM0_Dc;
        local_48._0_4_ = IVar25.Min.x;
        local_48._4_4_ = IVar25.Min.y;
        local_48._12_4_ = extraout_XMM0_Dd;
        local_d8._8_4_ = fVar22;
        local_d8._0_4_ = IVar25.Max.x;
        local_d8._4_4_ = IVar25.Max.y;
        local_d8._12_4_ = fVar24;
        IVar25 = ImGuiWindow::TitleBarRect(this);
        thumb_r_scaled.Min.x =
             (float)(int)((float)local_48._0_4_ * (float)local_58._0_4_ + local_68);
        thumb_r_scaled.Min.y =
             (float)(int)((float)local_48._4_4_ * (float)local_58._4_4_ + fStack_64);
        thumb_r_scaled.Max.x =
             (float)(int)((float)local_d8._0_4_ * (float)local_58._0_4_ + local_68);
        thumb_r_scaled.Max.y =
             (float)(int)((float)local_d8._4_4_ * (float)local_58._4_4_ + fStack_64);
        local_e8.Min.x = (float)(int)(IVar25.Min.x * (float)local_58._0_4_ + local_68);
        local_e8.Min.y = (float)(int)(IVar25.Min.y * (float)local_58._4_4_ + fStack_64);
        local_e8.Max.x = (float)(int)(IVar25.Max.x * (float)local_58._0_4_ + local_68);
        local_e8.Max.y = local_e8.Min.y + 5.0;
        ImRect::ClipWithFull(&thumb_r_scaled,&local_f8);
        ImRect::ClipWithFull(&local_e8,&local_f8);
        uVar16 = 10;
        if (pIVar8->NavWindow != (ImGuiWindow *)0x0) {
          uVar16 = this->RootWindowForTitleBarHighlight ==
                   pIVar8->NavWindow->RootWindowForTitleBarHighlight | 10;
        }
        pIVar5 = pIVar4->DrawList;
        IVar10 = GetColorU32(2,fVar21);
        ImDrawList::AddRectFilled(pIVar5,&thumb_r_scaled.Min,&thumb_r_scaled.Max,IVar10,0.0,0xf);
        pIVar5 = pIVar4->DrawList;
        IVar10 = GetColorU32(uVar16,fVar21);
        ImDrawList::AddRectFilled(pIVar5,&local_e8.Min,&local_e8.Max,IVar10,0.0,0xf);
        pIVar5 = pIVar4->DrawList;
        IVar10 = GetColorU32(5,fVar21);
        fVar22 = 0.0;
        fVar24 = 0.0;
        ImDrawList::AddRect(pIVar5,&thumb_r_scaled.Min,&thumb_r_scaled.Max,IVar10,0.0,0xf,1.0);
        if ((this->DockNodeAsHost == (ImGuiDockNode *)0x0) ||
           (this = this->DockNodeAsHost->VisibleWindow, pIVar15 = local_b0,
           this != (ImGuiWindow *)0x0)) {
          pIVar5 = pIVar4->DrawList;
          font = pIVar8->Font;
          local_d8._0_4_ = pIVar8->FontSize;
          IVar10 = GetColorU32(0,fVar21);
          text = this->Name;
          text_end = FindRenderedTextEnd(text,(char *)0x0);
          fVar22 = 0.0;
          fVar24 = 0.0;
          ImDrawList::AddText(pIVar5,font,(float)local_d8._0_4_,&local_e8.Min,IVar10,text,text_end,
                              0.0,(ImVec4 *)0x0);
          pIVar15 = local_b0;
        }
      }
    }
    IVar10 = GetColorU32(5,fVar21);
    ImDrawList::AddRect(local_c0,&local_f8.Min,&local_f8.Max,IVar10,0.0,0xf,1.0);
    iVar9 = local_c8->Size;
    uVar14 = (ulong)((int)local_b8 + 1);
  }
  thumb_r_scaled.Min.y = ((float)local_a8._0_4_ - (float)local_98._0_4_) * fStack_84;
  thumb_r_scaled.Min.x = ((float)local_a8._4_4_ - (float)local_98._4_4_) * local_88;
  Dummy(&thumb_r_scaled.Min);
  return;
}

Assistant:

void ImGui::ShowViewportThumbnails()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We don't display full monitor bounds (we could, but it often looks awkward), instead we display just enough to cover all of our viewports.
    float SCALE = 1.0f / 8.0f;
    ImRect bb_full;
    //for (int n = 0; n < g.PlatformIO.Monitors.Size; n++)
    //    bb_full.Add(GetPlatformMonitorMainRect(g.PlatformIO.Monitors[n]));
    for (int n = 0; n < g.Viewports.Size; n++)
        bb_full.Add(g.Viewports[n]->GetMainRect());
    ImVec2 p = window->DC.CursorPos;
    ImVec2 off = p - bb_full.Min * SCALE;
    //for (int n = 0; n < g.PlatformIO.Monitors.Size; n++)
    //    window->DrawList->AddRect(off + g.PlatformIO.Monitors[n].MainPos * SCALE, off + (g.PlatformIO.Monitors[n].MainPos + g.PlatformIO.Monitors[n].MainSize) * SCALE, ImGui::GetColorU32(ImGuiCol_Border));
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        ImRect viewport_draw_bb(off + (viewport->Pos) * SCALE, off + (viewport->Pos + viewport->Size) * SCALE);
        RenderViewportThumbnail(window->DrawList, viewport, viewport_draw_bb);
    }
    ImGui::Dummy(bb_full.GetSize() * SCALE);
}